

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

double regularizer_direction_magnitude(vw *all,bfgs *b,float regularizer)

{
  long in_RDI;
  float in_XMM0_Da;
  double ret;
  dense_parameters *in_stack_00000068;
  double in_stack_00000070;
  bfgs *in_stack_00000078;
  vw *in_stack_00000080;
  sparse_parameters *in_stack_00000088;
  double in_stack_00000090;
  bfgs *in_stack_00000098;
  vw *in_stack_000000a0;
  undefined8 local_8;
  
  if ((in_XMM0_Da != 0.0) || (NAN(in_XMM0_Da))) {
    if ((*(byte *)(in_RDI + 0x3590) & 1) == 0) {
      local_8 = regularizer_direction_magnitude<dense_parameters>
                          (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068);
    }
    else {
      local_8 = regularizer_direction_magnitude<sparse_parameters>
                          (in_stack_000000a0,in_stack_00000098,in_stack_00000090,in_stack_00000088);
    }
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

double regularizer_direction_magnitude(vw& all, bfgs& b, float regularizer)
{
  // compute direction magnitude
  double ret = 0.;

  if (regularizer == 0.)
    return ret;

  if (all.weights.sparse)
    return regularizer_direction_magnitude(all, b, regularizer, all.weights.sparse_weights);
  else
    return regularizer_direction_magnitude(all, b, regularizer, all.weights.dense_weights);
}